

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtIsUnate(word *t,int nVars)

{
  int iVar1;
  int iVar2;
  int iVar;
  
  iVar = 0;
  iVar2 = 0;
  if (0 < nVars) {
    iVar2 = nVars;
  }
  while( true ) {
    if (iVar2 == iVar) {
      return 1;
    }
    iVar1 = Abc_TtNegVar(t,nVars,iVar);
    if ((iVar1 == 0) && (iVar1 = Abc_TtPosVar(t,nVars,iVar), iVar1 == 0)) break;
    iVar = iVar + 1;
  }
  return 0;
}

Assistant:

static inline int Abc_TtIsUnate( word * t, int nVars )
{
    int i;
    for ( i = 0; i < nVars; i++ )
        if ( !Abc_TtNegVar(t, nVars, i) && !Abc_TtPosVar(t, nVars, i) )
            return 0;
    return 1;
}